

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSMC.h
# Opt level: O3

void __thiscall
chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>::
ContIntLoadResidual_F
          (ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
           *this,ChVectorDynamic<> *R,double c)

{
  ChContactable_3vars<6,_6,_6> *pCVar1;
  double dVar2;
  int iVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double local_48;
  double dStack_40;
  double local_38;
  double local_28;
  double dStack_20;
  undefined8 local_18;
  
  dVar5 = c * (this->m_force).m_data[0];
  dVar6 = c * (this->m_force).m_data[1];
  dVar2 = c * (this->m_force).m_data[2];
  local_48 = dVar5;
  dStack_40 = dVar6;
  local_38 = dVar2;
  iVar3 = (*(((this->
              super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
              ).objA)->super_ChContactable)._vptr_ChContactable[2])();
  if ((char)iVar3 != '\0') {
    pCVar1 = (this->
             super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
             ).objA;
    local_28 = -dVar5;
    dStack_20 = -dVar6;
    auVar4._0_8_ = -dVar2;
    auVar4._8_8_ = 0x8000000000000000;
    local_18 = vmovlpd_avx(auVar4);
    (*(pCVar1->super_ChContactable)._vptr_ChContactable[0xc])
              (pCVar1,&local_28,
               &(this->
                super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
                ).p1,R);
  }
  iVar3 = (*(((this->
              super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
              ).objB)->super_ChContactable)._vptr_ChContactable[2])();
  if ((char)iVar3 != '\0') {
    pCVar1 = (this->
             super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
             ).objB;
    (*(pCVar1->super_ChContactable)._vptr_ChContactable[0xc])
              (pCVar1,&local_48,
               &(this->
                super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
                ).p2,R);
  }
  return;
}

Assistant:

virtual void ContIntLoadResidual_F(ChVectorDynamic<>& R, const double c) override {
        ChVector<> abs_force_scaled(m_force * c);

        if (this->objA->IsContactActive())
            this->objA->ContactForceLoadResidual_F(-abs_force_scaled, this->p1, R);

        if (this->objB->IsContactActive())
            this->objB->ContactForceLoadResidual_F(abs_force_scaled, this->p2, R);
    }